

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

int event_track::gen_avail_files
              (uint32_t track_duration,uint32_t seg_duration_ticks_ms,uint32_t avail_duration,
              uint32_t avail_interval,uint64_t start_time)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  pointer pDVar5;
  uchar *puVar6;
  size_type sVar7;
  string local_418;
  undefined1 local_3f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dec;
  string base64_mes;
  __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
  local_3b8;
  iterator it2;
  ofstream ot;
  allocator local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  DASHEventMessageBoxv1 ev;
  uint64_t st_2;
  uint64_t track_duration_2;
  uint32_t id_count;
  uint32_t track_id;
  uint32_t timescale;
  string out_file_mpd;
  allocator local_59;
  undefined1 local_58 [8];
  string out_file_cmfm;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  events;
  uint64_t start_time_local;
  uint32_t avail_interval_local;
  uint32_t avail_duration_local;
  uint32_t seg_duration_ticks_ms_local;
  uint32_t track_duration_local;
  
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  vector((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
          *)((long)&out_file_cmfm.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"out_avail_track.cmfm",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&timescale,"out_avail_track.mpd",(allocator *)((long)&track_id + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&track_id + 3));
  track_duration_2._0_4_ = 0;
  ev.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)start_time;
  while (ev.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage < (pointer)(start_time + track_duration)) {
    DASHEventMessageBoxv1::DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)local_188);
    ev.presentation_time_._4_4_ = (int)track_duration_2;
    ev.super_full_box._104_8_ =
         ev.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    ev.super_full_box.super_box._100_4_ = 1000;
    ev.presentation_time_._0_4_ = avail_duration;
    std::__cxx11::string::operator=((string *)&ev.event_duration_,"urn:scte:scte35:2013:bin");
    fmp4_stream::gen_splice_insert
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&ev.value_.field_2 + 8),ev.presentation_time_._4_4_,
               (uint32_t)ev.presentation_time_ * 0x5a,false);
    ev.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ev.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + avail_interval;
    std::
    vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
    ::push_back((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                 *)((long)&out_file_cmfm.field_2 + 8),(value_type *)local_188);
    DASHEventMessageBoxv1::~DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)local_188);
    track_duration_2._0_4_ = (int)track_duration_2 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"test_urn",&local_1a9);
  write_to_segmented_event_track_file
            ((string *)local_58,
             (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
              *)((long)&out_file_cmfm.field_2 + 8),99,start_time,track_duration + start_time,
             &local_1a8,(ulong)seg_duration_ticks_ms,1000);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  poVar3 = std::operator<<((ostream *)&std::cout,"wrote event track ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"generating the MPD");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::ofstream(&it2,"out_avail_track.mpd",_S_out);
  poVar3 = std::operator<<((ostream *)&it2,"<EventStream ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar4 = std::
           vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
           ::operator[]((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                         *)((long)&out_file_cmfm.field_2 + 8),0);
  iVar2 = std::__cxx11::string::compare((char *)&pvVar4->scheme_id_uri_);
  if (iVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&it2,"schemeIdUri=");
    poVar3 = std::operator<<(poVar3,'\"');
    poVar3 = std::operator<<(poVar3,"urn:scte:scte35:2014:xml+bin");
    poVar3 = std::operator<<(poVar3,'\"');
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&it2,"schemeIdUri=");
    poVar3 = std::operator<<(poVar3,'\"');
    pvVar4 = std::
             vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
             ::operator[]((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                           *)((long)&out_file_cmfm.field_2 + 8),0);
    poVar3 = std::operator<<(poVar3,(string *)&pvVar4->scheme_id_uri_);
    poVar3 = std::operator<<(poVar3,'\"');
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&it2," timescale=");
  poVar3 = std::operator<<(poVar3,'\"');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1000);
  poVar3 = std::operator<<(poVar3,'\"');
  poVar3 = std::operator<<(poVar3,">");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_3b8._M_current =
       (DASHEventMessageBoxv1 *)
       std::
       vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
       ::begin((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                *)((long)&out_file_cmfm.field_2 + 8));
  while( true ) {
    base64_mes.field_2._8_8_ =
         std::
         vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
         ::end((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                *)((long)&out_file_cmfm.field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_3b8,
                       (__normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
                        *)((long)&base64_mes.field_2 + 8));
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout," writing an event to output ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&it2,"<Event ");
    poVar3 = std::operator<<(poVar3,"presentationTime=");
    poVar3 = std::operator<<(poVar3,'\"');
    pDVar5 = __gnu_cxx::
             __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
             ::operator->(&local_3b8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pDVar5->presentation_time_);
    poVar3 = std::operator<<(poVar3,'\"');
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"duration=");
    poVar3 = std::operator<<(poVar3,'\"');
    pDVar5 = __gnu_cxx::
             __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
             ::operator->(&local_3b8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pDVar5->event_duration_);
    poVar3 = std::operator<<(poVar3,'\"');
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"id=");
    poVar3 = std::operator<<(poVar3,'\"');
    pDVar5 = __gnu_cxx::
             __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
             ::operator->(&local_3b8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pDVar5->id_);
    std::operator<<(poVar3,'\"');
    pDVar5 = __gnu_cxx::
             __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
             ::operator->(&local_3b8);
    iVar2 = std::__cxx11::string::compare((char *)&pDVar5->scheme_id_uri_);
    if (iVar2 == 0) {
      pDVar5 = __gnu_cxx::
               __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
               ::operator->(&local_3b8);
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&pDVar5->message_data_);
      pDVar5 = __gnu_cxx::
               __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
               ::operator->(&local_3b8);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&pDVar5->message_data_);
      base64_encode_abi_cxx11_
                ((string *)
                 &dec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,puVar6,sVar7 & 0xffffffff);
      base64_decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f8,
                    (string *)
                    &dec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      poVar3 = std::operator<<((ostream *)&std::cout,"base64 of cue: ");
      poVar3 = std::operator<<(poVar3,(string *)
                                      &dec.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&it2,'>');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"  <Signal xmlns=");
      poVar3 = std::operator<<(poVar3,'\"');
      poVar3 = std::operator<<(poVar3,"http://www.scte.org/schemas/35/2016");
      poVar3 = std::operator<<(poVar3,'\"');
      poVar3 = std::operator<<(poVar3,'>');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"    <Binary>");
      poVar3 = std::operator<<(poVar3,(string *)
                                      &dec.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = std::operator<<(poVar3,"</Binary>");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"  </Signal>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f8);
      std::__cxx11::string::~string
                ((string *)
                 &dec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      poVar3 = std::operator<<((ostream *)&it2," ");
      poVar3 = std::operator<<(poVar3,"contentEncoding=");
      poVar3 = std::operator<<(poVar3,'\"');
      poVar3 = std::operator<<(poVar3,"base64");
      poVar3 = std::operator<<(poVar3,'\"');
      poVar3 = std::operator<<(poVar3,'>');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pDVar5 = __gnu_cxx::
               __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
               ::operator->(&local_3b8);
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&pDVar5->message_data_);
      pDVar5 = __gnu_cxx::
               __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
               ::operator->(&local_3b8);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&pDVar5->message_data_);
      base64_encode_abi_cxx11_(&local_418,puVar6,sVar7 & 0xffffffff);
      poVar3 = std::operator<<(poVar3,(string *)&local_418);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_418);
    }
    poVar3 = std::operator<<((ostream *)&it2,"</Event>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<event_track::DASHEventMessageBoxv1_*,_std::vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>_>
    ::operator++(&local_3b8,0);
  }
  poVar3 = std::operator<<((ostream *)&it2,"</EventStream> ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(&it2);
  std::__cxx11::string::~string((string *)&timescale);
  std::__cxx11::string::~string((string *)local_58);
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  ~vector((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
           *)((long)&out_file_cmfm.field_2 + 8));
  return 0;
}

Assistant:

int event_track::gen_avail_files(uint32_t track_duration, 
	uint32_t seg_duration_ticks_ms, 
	uint32_t avail_duration, 
	uint32_t avail_interval, 
	uint64_t start_time)
{
	std::vector<event_track::DASHEventMessageBoxv1> events;

	std::string out_file_cmfm = "out_avail_track.cmfm";
	std::string out_file_mpd = "out_avail_track.mpd";

	uint32_t timescale = 1000;
	uint32_t track_id = 99; // default track_id

	uint32_t id_count = 0;

	uint64_t track_duration_2 = start_time + track_duration;
	uint64_t st_2 = start_time;

	while (st_2 < track_duration_2)
	{
		event_track::DASHEventMessageBoxv1 ev;
		ev.id_ = id_count++;
		ev.presentation_time_ = st_2;
		ev.event_duration_ = avail_duration;
		ev.timescale_ = timescale;
		ev.scheme_id_uri_ = "urn:scte:scte35:2013:bin";
		fmp4_stream::gen_splice_insert(ev.message_data_, ev.id_, ev.event_duration_ * 90, false);
		st_2 += avail_interval;
		events.push_back(ev);
	}

	event_track::write_to_segmented_event_track_file(
		out_file_cmfm, events,
		track_id, start_time,
		track_duration + start_time, "test_urn",
		seg_duration_ticks_ms, timescale);

	std::cout << "wrote event track " << std::endl;


	std::cout << "generating the MPD" << std::endl;
	std::ofstream ot = std::ofstream("out_avail_track.mpd");
	ot << "<EventStream " << std::endl;
	if (events[0].scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // convert binary scte 214 to xml + bin
	{
		ot << "schemeIdUri=" << '"' << "urn:scte:scte35:2014:xml+bin" << '"' << std::endl;
	}
	else {
		ot << "schemeIdUri=" << '"' << events[0].scheme_id_uri_ << '"' << std::endl;
	}
	ot << " timescale=" << '"' << timescale << '"' << ">" << std::endl;

	// write each of the event messages as moof mdat combinations in sparse track 
	for (auto it2 = events.begin(); it2 != events.end(); it2++)
	{
		std::cout << " writing an event to output " << std::endl;
		ot << "<Event "
			<< "presentationTime=" << '"' << it2->presentation_time_ << '"' << " "  \
			<< "duration=" << '"' << it2->event_duration_ << '"' << " "  \
			<< "id=" << '"' << it2->id_ << '"';
		if (it2->scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
		{ 
			
			std::string base64_mes = base64_encode(it2->message_data_.data(), (unsigned int)it2->message_data_.size());
			std::vector<uint8_t> dec = base64_decode(base64_mes);
			std::cout << "base64 of cue: " << base64_mes << std::endl;
			ot << '>' << std::endl << "  <Signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
				<< "    <Binary>" << base64_mes << "</Binary>" << std::endl
				<< "  </Signal>" << std::endl;
		}
		else {
			ot << " " << "contentEncoding=" << '"' << "base64" << '"' << '>' << std::endl
				<< base64_encode(it2->message_data_.data(), (unsigned int)it2->message_data_.size()) << std::endl;
		}
		ot << "</Event>" << std::endl;
	}

	ot << "</EventStream> " << std::endl;
	ot.close();

	return 0;
}